

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O1

void __thiscall
rsg::ProgramExecutor::execute
          (ProgramExecutor *this,Shader *vertexShader,Shader *fragmentShader,
          vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *uniformValues)

{
  int iVar1;
  ShaderInput *pSVar2;
  Variable *pVVar3;
  pointer pSVar4;
  ConstValueAccess vtx1;
  ConstValueRangeAccess valueRange;
  ConstValueAccess vtx2;
  ConstValueAccess vtx3;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  deBool dVar8;
  int iVar9;
  int iVar10;
  VaryingStorage *pVVar11;
  Scalar *pSVar12;
  VariableType *this_00;
  TestError *this_01;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  pointer pVVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  pointer ppSVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float __x;
  float fVar31;
  ExecValueAccess EVar32;
  ConstStridedValueAccess<64> src;
  ValueAccess dst;
  StridedValueAccess<64> dst_00;
  ConstValueAccess vtx0;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> outputs;
  Vec4 c;
  ExecutionContext execCtx;
  VaryingStore varyingStore;
  ulong local_1d8;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> local_1b8;
  Shader *local_198;
  Scalar *local_190;
  VariableType *local_188;
  ConstStridedValueAccess<64> local_180;
  ProgramExecutor *local_170;
  long local_168;
  SamplerCubeMap *local_160;
  VaryingStorage *local_158;
  int local_150;
  int local_14c;
  long local_148;
  ulong local_140;
  Variable *local_138;
  ulong local_130;
  ulong local_128;
  pointer local_120;
  Variable *local_118;
  Scalar *pSStack_110;
  Variable *local_108;
  Scalar *pSStack_100;
  Variable *local_f8;
  Scalar *pSStack_f0;
  ConstStridedValueAccess<64> local_e8;
  Variable *local_d8;
  pointer pSStack_d0;
  Scalar *local_c8;
  ExecutionContext local_c0;
  VaryingStore local_68;
  
  iVar1 = this->m_gridWidth;
  iVar15 = this->m_gridHeight;
  iVar7 = iVar1 + 1;
  uVar17 = (iVar15 + 1) * iVar7;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198 = fragmentShader;
  local_170 = this;
  local_68.m_numVertices = uVar17;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ExecutionContext::ExecutionContext(&local_c0,&this->m_samplers2D,&this->m_samplersCube);
  local_190 = (Scalar *)CONCAT44(local_190._4_4_,(uVar17 + 1) - (uint)((uVar17 & 0x3f) == 0));
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_160 = &this->m_samplersCube;
  Shader::getOutputs(vertexShader,&local_1b8);
  pVVar19 = (uniformValues->
            super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pVVar19 !=
      (uniformValues->super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_180.m_type = &pVVar19->m_variable->m_type;
      local_180.m_value =
           (pVVar19->m_storage).m_value.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_e8 = (ConstStridedValueAccess<64>)
                 ExecutionContext::getValue(&local_c0,pVVar19->m_variable);
      StridedValueAccess<64>::operator=
                ((StridedValueAccess<64> *)&local_e8,(StridedValueRead<1> *)&local_180);
      pVVar19 = pVVar19 + 1;
    } while (pVVar19 !=
             (uniformValues->
             super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (0 < (int)local_190) {
    uVar13 = 0x40;
    local_188 = (VariableType *)((ulong)local_188 & 0xffffffff00000000);
    iVar18 = 0;
    iVar10 = 0;
    do {
      uVar14 = uVar17;
      if ((int)uVar13 < (int)uVar17) {
        uVar14 = uVar13;
      }
      local_158 = (VaryingStorage *)CONCAT44(local_158._4_4_,iVar10 + 1);
      uVar16 = (iVar10 + 1) * 0x40;
      if ((int)uVar17 <= (int)uVar16) {
        uVar16 = uVar17;
      }
      ppSVar24 = (vertexShader->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      if (ppSVar24 !=
          (vertexShader->m_inputs).
          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pSVar2 = *ppSVar24;
          EVar32 = ExecutionContext::getValue(&local_c0,pSVar2->m_variable);
          if (iVar10 << 6 < (int)uVar16) {
            iVar23 = 0;
            do {
              local_d8 = pSVar2->m_variable;
              pSStack_d0 = (pSVar2->m_min).
                           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                           super__Vector_impl_data._M_start;
              uVar5 = pSVar2->m_variable;
              uVar6 = (pSVar2->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                      _M_impl.super__Vector_impl_data._M_start;
              valueRange.m_min = (Scalar *)uVar6;
              valueRange.m_type = (VariableType *)uVar5;
              local_c8 = (pSVar2->m_max).
                         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                         super__Vector_impl_data._M_start;
              valueRange.m_max = local_c8;
              interpolateVertexInput<64>
                        ((StridedValueAccess<64>)EVar32.super_ConstStridedValueAccess<64>,iVar23,
                         valueRange,(float)((iVar23 + iVar18) % iVar7) / (float)iVar1,
                         (float)((iVar23 + iVar18) / iVar7) / (float)iVar15);
              iVar23 = iVar23 + 1;
            } while ((iVar18 - uVar14) + iVar23 != 0);
          }
          ppSVar24 = ppSVar24 + 1;
        } while (ppSVar24 !=
                 (vertexShader->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      Shader::execute(vertexShader,&local_c0);
      if (local_1b8.
          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1b8.
          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar23 = uVar14 + (int)local_188;
        pSVar12 = (Scalar *)
                  local_1b8.
                  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          pVVar3 = *(Variable **)pSVar12;
          dVar8 = deStringEqual((pVVar3->m_name)._M_dataplus._M_p,"gl_Position");
          if (dVar8 == 0) {
            src = (ConstStridedValueAccess<64>)ExecutionContext::getValue(&local_c0,pVVar3);
            pVVar11 = VaryingStore::getStorage
                                (&local_68,&pVVar3->m_type,(pVVar3->m_name)._M_dataplus._M_p);
            if (iVar10 << 6 < (int)uVar16) {
              iVar20 = 0;
              do {
                iVar9 = VariableType::getScalarSize(&pVVar3->m_type);
                dst.super_ConstStridedValueAccess<1>.m_value =
                     (pVVar11->m_value).
                     super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar9 * (iVar20 + iVar18);
                dst.super_ConstStridedValueAccess<1>.m_type = &pVVar3->m_type;
                copyVarying<64>(dst,src,iVar20);
                iVar20 = iVar20 + 1;
              } while (iVar23 != iVar20);
            }
          }
          pSVar12 = pSVar12 + 2;
        } while (pSVar12 !=
                 (Scalar *)
                 local_1b8.
                 super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      uVar13 = uVar13 + 0x40;
      iVar18 = iVar18 + 0x40;
      local_188 = (VariableType *)CONCAT44(local_188._4_4_,(int)local_188 + -0x40);
      iVar10 = (int)local_158;
    } while ((int)local_158 != (int)local_190);
  }
  if ((Scalar *)
      local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (Scalar *)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ExecutionContext::~ExecutionContext(&local_c0);
  ExecutionContext::ExecutionContext(&local_c0,&this->m_samplers2D,local_160);
  pVVar19 = (uniformValues->
            super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pVVar19 !=
      (uniformValues->super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pVVar19->m_variable;
      local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)(pVVar19->m_storage).m_value.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_180 = (ConstStridedValueAccess<64>)
                  ExecutionContext::getValue(&local_c0,pVVar19->m_variable);
      StridedValueAccess<64>::operator=
                ((StridedValueAccess<64> *)&local_180,(StridedValueRead<1> *)&local_1b8);
      pVVar19 = pVVar19 + 1;
    } while (pVVar19 !=
             (uniformValues->
             super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Shader::getOutputs(local_198,&local_1b8);
  for (pSVar12 = (Scalar *)
                 local_1b8.
                 super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pSVar12 !=
      (Scalar *)
      local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; pSVar12 = pSVar12 + 2) {
    local_138 = *(Variable **)pSVar12;
    if (local_138->m_layoutLocation == 0) goto LAB_00a75276;
  }
  local_138 = (Variable *)0x0;
LAB_00a75276:
  if (local_138 != (Variable *)0x0) {
    iVar1 = (local_170->m_dst).super_ConstPixelBufferAccess.m_size.m_data[0];
    iVar15 = (local_170->m_dst).super_ConstPixelBufferAccess.m_size.m_data[1];
    uVar13 = iVar15 * iVar1;
    local_130 = (ulong)uVar13;
    uVar17 = uVar13 + 0x3f;
    if (-1 < (int)uVar13) {
      uVar17 = uVar13;
    }
    uVar13 = (uint)((uVar13 & 0x3f) != 0);
    uVar14 = uVar13 + ((int)uVar17 >> 6);
    if (uVar14 != 0 && SCARRY4(uVar13,(int)uVar17 >> 6) == (int)uVar14 < 0) {
      fVar30 = (float)iVar1 / (float)local_170->m_gridWidth;
      fVar31 = (float)iVar15 / (float)local_170->m_gridHeight;
      local_140 = (ulong)uVar14;
      local_150 = -iVar1;
      iVar15 = 0x40;
      uVar21 = 0;
      local_1d8 = 0;
      do {
        iVar18 = (int)local_130;
        iVar10 = iVar18;
        if (iVar15 < iVar18) {
          iVar10 = iVar15;
        }
        local_148 = uVar21 << 6;
        uVar21 = uVar21 + 1;
        iVar23 = (int)uVar21 * 0x40;
        if (iVar18 <= iVar23) {
          iVar23 = iVar18;
        }
        ppSVar24 = (local_198->m_inputs).
                   super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_168 = (long)iVar23;
        if (ppSVar24 !=
            (local_198->m_inputs).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_160 = (SamplerCubeMap *)CONCAT44(local_160._4_4_,(int)local_1d8 - iVar10);
          local_14c = iVar15;
          local_128 = uVar21;
          do {
            pSVar2 = *ppSVar24;
            EVar32 = ExecutionContext::getValue(&local_c0,pSVar2->m_variable);
            local_190 = EVar32.super_ConstStridedValueAccess<64>.m_value;
            local_188 = EVar32.super_ConstStridedValueAccess<64>.m_type;
            pVVar3 = pSVar2->m_variable;
            local_158 = VaryingStore::getStorage
                                  (&local_68,&pVVar3->m_type,(pVVar3->m_name)._M_dataplus._M_p);
            local_120 = ppSVar24;
            if (local_148 < local_168) {
              iVar15 = 0;
              do {
                fVar25 = (float)(((int)local_1d8 + iVar15) % iVar1);
                fVar26 = floorf(fVar25 / fVar30);
                fVar29 = (float)(((int)local_1d8 + iVar15) / iVar1);
                fVar27 = floorf(fVar29 / fVar31);
                fVar25 = (fVar25 + 0.5) / fVar30;
                __x = (fVar29 + 0.5) / fVar31;
                fVar29 = floorf(fVar25);
                fVar28 = floorf(__x);
                iVar10 = VariableType::getScalarSize(&pVVar3->m_type);
                pVVar11 = local_158;
                iVar9 = (int)fVar26;
                iVar23 = iVar7 * (int)fVar27;
                pSVar4 = (local_158->m_value).
                         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar18 = VariableType::getScalarSize(&pVVar3->m_type);
                pSStack_f0 = (pVVar11->m_value).
                             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                             super__Vector_impl_data._M_start + iVar18 * (iVar23 + iVar9 + 1);
                local_f8 = pVVar3;
                iVar18 = VariableType::getScalarSize(&pVVar3->m_type);
                iVar20 = ((int)fVar27 + 1) * iVar7;
                pSStack_100 = (pVVar11->m_value).
                              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                              super__Vector_impl_data._M_start + iVar18 * (iVar9 + iVar20);
                local_108 = pVVar3;
                iVar18 = VariableType::getScalarSize(&pVVar3->m_type);
                pSStack_110 = (pVVar11->m_value).
                              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                              super__Vector_impl_data._M_start + iVar18 * (iVar9 + iVar20 + 1);
                vtx1.m_value = pSStack_f0;
                vtx1.m_type = &local_f8->m_type;
                vtx2.m_value = pSStack_100;
                vtx2.m_type = &local_108->m_type;
                vtx3.m_value = pSStack_110;
                vtx3.m_type = &pVVar3->m_type;
                dst_00.super_ConstStridedValueAccess<64>.m_value = local_190;
                dst_00.super_ConstStridedValueAccess<64>.m_type = local_188;
                vtx0.m_value = pSVar4 + (iVar23 + iVar9) * iVar10;
                vtx0.m_type = &pVVar3->m_type;
                local_118 = pVVar3;
                interpolateFragmentInput<64>
                          (dst_00,iVar15,vtx0,vtx1,vtx2,vtx3,fVar25 - fVar29,__x - fVar28);
                iVar15 = iVar15 + 1;
              } while ((int)local_160 + iVar15 != 0);
            }
            ppSVar24 = local_120 + 1;
            uVar21 = local_128;
            iVar15 = local_14c;
          } while (ppSVar24 !=
                   (local_198->m_inputs).
                   super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        Shader::execute(local_198,&local_c0);
        EVar32 = ExecutionContext::getValue(&local_c0,local_138);
        this_00 = EVar32.super_ConstStridedValueAccess<64>.m_type;
        if (local_148 < local_168) {
          pSVar12 = EVar32.super_ConstStridedValueAccess<64>.m_value + 0xc0;
          uVar22 = local_1d8;
          do {
            VariableType::getElementType(this_00);
            iVar10 = pSVar12[-0xc0].intVal;
            VariableType::getElementType(this_00);
            iVar18 = pSVar12[-0x80].intVal;
            VariableType::getElementType(this_00);
            iVar23 = pSVar12[-0x40].intVal;
            VariableType::getElementType(this_00);
            uVar17 = (uint)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff)
                           / (long)iVar1);
            local_180.m_type._4_4_ = iVar18;
            local_180.m_type._0_4_ = iVar10;
            local_180.m_value._0_4_ = iVar23;
            local_180.m_value._4_4_ = pSVar12->intVal;
            tcu::PixelBufferAccess::setPixel
                      (&local_170->m_dst,(Vec4 *)&local_180,local_150 * uVar17 + (int)uVar22,
                       ~uVar17 + (local_170->m_dst).super_ConstPixelBufferAccess.m_size.m_data[1],0)
            ;
            uVar22 = uVar22 + 1;
            pSVar12 = pSVar12 + 1;
          } while ((long)uVar22 < local_168);
        }
        iVar15 = iVar15 + 0x40;
        local_1d8 = local_1d8 + 0x40;
      } while (uVar21 != local_140);
    }
    if ((Scalar *)
        local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (Scalar *)0x0) {
      operator_delete(local_1b8.
                      super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b8.
                            super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.
                            super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    ExecutionContext::~ExecutionContext(&local_c0);
    VaryingStore::~VaryingStore(&local_68);
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"fragColorVar",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,299);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ProgramExecutor::execute (const Shader& vertexShader, const Shader& fragmentShader, const vector<VariableValue>& uniformValues)
{
	int	gridVtxWidth	= m_gridWidth+1;
	int gridVtxHeight	= m_gridHeight+1;
	int numVertices		= gridVtxWidth*gridVtxHeight;

	VaryingStore varyingStore(numVertices);

	// Execute vertex shader
	{
		ExecutionContext	execCtx(m_samplers2D, m_samplersCube);
		int					numPackets	= numVertices + ((numVertices%EXEC_VEC_WIDTH) ? 1 : 0);

		const vector<ShaderInput*>& inputs	= vertexShader.getInputs();
		vector<const Variable*>		outputs;
		vertexShader.getOutputs(outputs);

		// Set uniform values
		for (vector<VariableValue>::const_iterator uniformIter = uniformValues.begin(); uniformIter != uniformValues.end(); uniformIter++)
			execCtx.getValue(uniformIter->getVariable()) = uniformIter->getValue().value();

		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			int packetStart	= packetNdx*EXEC_VEC_WIDTH;
			int packetEnd	= deMin32((packetNdx+1)*EXEC_VEC_WIDTH, numVertices);

			// Compute values for vertex shader inputs
			for (vector<ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
			{
				const ShaderInput*	input	= *i;
				ExecValueAccess		access	= execCtx.getValue(input->getVariable());

				for (int vtxNdx = packetStart; vtxNdx < packetEnd; vtxNdx++)
				{
					int		y	= (vtxNdx/gridVtxWidth);
					int		x	= vtxNdx - y*gridVtxWidth;
					float	xf	= (float)x / (float)(gridVtxWidth-1);
					float	yf	= (float)y / (float)(gridVtxHeight-1);

					interpolateVertexInput(access, vtxNdx-packetStart, input->getValueRange(), xf, yf);
				}
			}

			// Execute vertex shader for packet
			vertexShader.execute(execCtx);

			// Store output values
			for (vector<const Variable*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
			{
				const Variable*			output	= *i;

				if (deStringEqual(output->getName(), "gl_Position"))
					continue; // Do not store position

				ExecConstValueAccess	access	= execCtx.getValue(output);
				VaryingStorage*			dst		= varyingStore.getStorage(output->getType(), output->getName());

				for (int vtxNdx = packetStart; vtxNdx < packetEnd; vtxNdx++)
				{
					ValueAccess varyingAccess = dst->getValue(output->getType(), vtxNdx);
					copyVarying(varyingAccess, access, vtxNdx-packetStart);
				}
			}
		}
	}

	// Execute fragment shader
	{
		ExecutionContext execCtx(m_samplers2D, m_samplersCube);

		// Assign uniform values
		for (vector<VariableValue>::const_iterator i = uniformValues.begin(); i != uniformValues.end(); i++)
			execCtx.getValue(i->getVariable()) = i->getValue().value();

		const vector<ShaderInput*>& inputs			= fragmentShader.getInputs();
		const Variable*				fragColorVar	= DE_NULL;
		vector<const Variable*>		outputs;

		// Find fragment shader output assigned to location 0. This is fragment color.
		fragmentShader.getOutputs(outputs);
		for (vector<const Variable*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
		{
			if ((*i)->getLayoutLocation() == 0)
			{
				fragColorVar = *i;
				break;
			}
		}
		TCU_CHECK(fragColorVar);

		int	width		= m_dst.getWidth();
		int height		= m_dst.getHeight();
		int numPackets	= (width*height)/EXEC_VEC_WIDTH + (((width*height)%EXEC_VEC_WIDTH) ? 1 : 0);

		float cellWidth		= (float)width	/ (float)m_gridWidth;
		float cellHeight	= (float)height	/ (float)m_gridHeight;

		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			int packetStart	= packetNdx*EXEC_VEC_WIDTH;
			int packetEnd	= deMin32((packetNdx+1)*EXEC_VEC_WIDTH, width*height);

			// Interpolate varyings
			for (vector<ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
			{
				const ShaderInput*		input	= *i;
				ExecValueAccess			access	= execCtx.getValue(input->getVariable());
				const VariableType&		type	= input->getVariable()->getType();
				const VaryingStorage*	src		= varyingStore.getStorage(type, input->getVariable()->getName());

				// \todo [2011-03-08 pyry] Part of this could be pre-computed...
				for (int fragNdx = packetStart; fragNdx < packetEnd; fragNdx++)
				{
					int y = fragNdx/width;
					int x = fragNdx - y*width;
					tcu::IVec4	vtxIndices	= computeVertexIndices(cellWidth, cellHeight, gridVtxWidth, gridVtxHeight, x, y);
					tcu::Vec2	weights		= computeGridCellWeights(cellWidth, cellHeight, x, y);

					interpolateFragmentInput(access, fragNdx-packetStart,
											 src->getValue(type, vtxIndices.x()),
											 src->getValue(type, vtxIndices.y()),
											 src->getValue(type, vtxIndices.z()),
											 src->getValue(type, vtxIndices.w()),
											 weights.x(), weights.y());
				}
			}

			// Execute fragment shader
			fragmentShader.execute(execCtx);

			// Write resulting color
			ExecConstValueAccess colorValue = execCtx.getValue(fragColorVar);
			for (int fragNdx = packetStart; fragNdx < packetEnd; fragNdx++)
			{
				int			y		= fragNdx/width;
				int			x		= fragNdx - y*width;
				int			cNdx	= fragNdx-packetStart;
				tcu::Vec4	c		= tcu::Vec4(colorValue.component(0).asFloat(cNdx),
												colorValue.component(1).asFloat(cNdx),
												colorValue.component(2).asFloat(cNdx),
												colorValue.component(3).asFloat(cNdx));

				// \todo [2012-11-13 pyry] Reverse order.
				m_dst.setPixel(c, x, m_dst.getHeight()-y-1);
			}
		}
	}
}